

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::reporters::Reporter_testLoggingReporter_Test::TestBody
          (Reporter_testLoggingReporter_Test *this)

{
  int iVar1;
  bool bVar2;
  long *local_30;
  LoggingReporter reporter;
  
  jaegertracing::logging::nullLogger();
  _reporter = &thrift::Span::vtable;
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    jaegertracing::reporters::LoggingReporter::report((Span *)&reporter);
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return;
}

Assistant:

TEST(Reporter, testLoggingReporter)
{
    const auto logger = logging::nullLogger();
    LoggingReporter reporter(*logger);
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    reporter.close();
}